

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::GatherBase::TestCompute(GatherBase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLuint shader;
  GLint location;
  int iVar2;
  undefined4 extraout_var;
  bool *compile_error;
  long lVar3;
  GLuint m_buffer;
  GLfloat local_80;
  GLfloat GStack_7c;
  long local_78;
  long local_70 [2];
  GLuint local_5c;
  undefined8 local_58;
  undefined1 local_48 [12];
  GLfloat local_3c;
  undefined1 local_38 [8];
  GLfloat local_30;
  
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1d])(&local_80,this);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (local_78 != 0) {
    shader = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
    glu::CallLogWrapper::glAttachShader(this_00,program,shader);
    glu::CallLogWrapper::glDeleteShader(this_00,shader);
    local_58._4_4_ = GStack_7c;
    glu::CallLogWrapper::glShaderSource(this_00,shader,1,(GLchar **)&local_58,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,shader);
  }
  this->program = program;
  if ((long *)CONCAT44(GStack_7c,local_80) != local_70) {
    operator_delete((long *)CONCAT44(GStack_7c,local_80),local_70[0] + 1);
    program = this->program;
  }
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = TGBase::CheckProgram(&this->super_TGBase,this->program,compile_error);
  lVar3 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glUseProgram(this_00,this->program);
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->program,"cs_in");
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(&local_80,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(&local_58,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(local_38,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(local_48,this);
    glu::CallLogWrapper::glUniform4f(this_00,location,local_80,local_58._4_4_,local_30,local_3c);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&local_5c);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,local_5c);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,local_5c);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    iVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x26])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&local_5c);
  }
  return lVar3;
}

Assistant:

virtual long TestCompute()
	{
		GLuint m_buffer;

		program = CreateComputeProgram(ComputeShader());
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glUniform4f(glGetUniformLocation(program, "cs_in"), BufferData().x(), BufferData().y(), BufferData().z(),
					BufferData().w());

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(Vec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glDispatchCompute(1, 1, 1);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		long error = VerifyCompute();
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		glDeleteBuffers(1, &m_buffer);

		return error;
	}